

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::DrawRectFilled(FloatRect *rect,Color *color,float rounding,int rounding_corners)

{
  Color CVar1;
  ImVec2 IVar2;
  ImU32 col;
  ImDrawList *this;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  
  this = GetWindowDrawList();
  IVar2 = GetCursorScreenPos();
  local_40.y = IVar2.y + rect->top;
  local_40.x = rect->left + IVar2.x;
  IVar2 = GetCursorScreenPos();
  local_48.y = IVar2.y + rect->top + rect->height;
  local_48.x = rect->left + rect->width + IVar2.x;
  CVar1 = *color;
  local_38.x = (float)((uint)CVar1 & 0xff) * 0.003921569;
  local_38.y = (float)((uint)CVar1 >> 8 & 0xff) * 0.003921569;
  local_38.z = (float)((uint)CVar1 >> 0x10 & 0xff) * 0.003921569;
  local_38.w = (float)((uint)CVar1 >> 0x18) * 0.003921569;
  col = ColorConvertFloat4ToU32(&local_38);
  ImDrawList::AddRectFilled(this,&local_40,&local_48,col,rounding,rounding_corners);
  return;
}

Assistant:

void DrawRectFilled(const sf::FloatRect& rect, const sf::Color& color, float rounding,
                    int rounding_corners) {
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    draw_list->AddRectFilled(getTopLeftAbsolute(rect), getDownRightAbsolute(rect),
                             ColorConvertFloat4ToU32(toImColor(color)), rounding, rounding_corners);
}